

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_extract_all.cpp
# Opt level: O1

int32_t duckdb::GetGroupIndex(DataChunk *args,idx_t row,int32_t *result)

{
  reference this;
  int32_t iVar1;
  UnifiedVectorFormat format;
  UnifiedVectorFormat local_60;
  
  if ((ulong)(((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5) < 3) {
    *result = 0;
    iVar1 = 1;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_60);
    this = vector<duckdb::Vector,_true>::operator[](&args->data,2);
    Vector::ToUnifiedFormat(this,args->count,&local_60);
    if ((local_60.sel)->sel_vector != (sel_t *)0x0) {
      row = (idx_t)(local_60.sel)->sel_vector[row];
    }
    if ((local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[row >> 6] >>
         (row & 0x3f) & 1) != 0)) {
      *result = *(int32_t *)(local_60.data + row * 4);
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
    }
    if (local_60.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return iVar1;
}

Assistant:

int32_t GetGroupIndex(DataChunk &args, idx_t row, int32_t &result) {
	if (args.ColumnCount() < 3) {
		result = 0;
		return true;
	}
	UnifiedVectorFormat format;
	args.data[2].ToUnifiedFormat(args.size(), format);
	idx_t index = format.sel->get_index(row);
	if (!format.validity.RowIsValid(index)) {
		return false;
	}
	result = UnifiedVectorFormat::GetData<int32_t>(format)[index];
	return true;
}